

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void run_ellswift_tests(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  secp256k1_sha256 sha_optimized;
  secp256k1_sha256 sha;
  int ret_5;
  void *data;
  secp256k1_ellswift_xdh_hash_function hash_function;
  uchar prefix64 [64];
  uchar share32_bad [32];
  uchar share32b [32];
  uchar share32a [32];
  uchar ell64b_bad [64];
  uchar ell64a_bad [64];
  uchar ell64b [64];
  uchar ell64a [64];
  secp256k1_scalar secb;
  secp256k1_scalar seca;
  uchar sec32b_bad [32];
  uchar sec32a_bad [32];
  uchar sec32b [32];
  uchar sec32a [32];
  uchar auxrnd32b_bad [32];
  uchar auxrnd32a_bad [32];
  uchar auxrnd32b [32];
  uchar auxrnd32a [32];
  int ret_4;
  secp256k1_pubkey pub_1;
  secp256k1_gej resj;
  secp256k1_gej decj;
  secp256k1_fe share_x;
  secp256k1_ge res_1;
  secp256k1_ge dec_1;
  secp256k1_scalar sec_1;
  uchar share32 [32];
  uchar sec32_1 [32];
  uchar ell64_2 [64];
  int ret_3;
  uchar ell64_1 [64];
  secp256k1_pubkey pub;
  secp256k1_ge dec;
  secp256k1_gej res;
  secp256k1_scalar sec;
  uchar sec32 [32];
  uchar auxrnd32 [32];
  secp256k1_pubkey pubkey2;
  secp256k1_pubkey pubkey_1;
  secp256k1_ge g2;
  secp256k1_ge g;
  uchar ell64 [64];
  uchar rnd32 [32];
  uchar *ell_b64;
  uchar *ell_a64;
  int party;
  int ret_2;
  uchar shared_secret [32];
  ellswift_xdh_test *test;
  int ret_1;
  secp256k1_ge ge;
  secp256k1_pubkey pubkey;
  ellswift_decode_test *testcase_1;
  secp256k1_fe x2;
  int ret;
  secp256k1_fe t;
  int c;
  ellswift_xswiftec_inv_test *testcase;
  int i;
  code *in_stack_fffffffffffff468;
  secp256k1_context *in_stack_fffffffffffff470;
  undefined6 in_stack_fffffffffffff478;
  undefined1 in_stack_fffffffffffff47e;
  undefined1 in_stack_fffffffffffff47f;
  uchar *in_stack_fffffffffffff480;
  secp256k1_context *in_stack_fffffffffffff488;
  secp256k1_sha256 *in_stack_fffffffffffff490;
  secp256k1_ge *in_stack_fffffffffffff498;
  long local_b60;
  long local_b58;
  secp256k1_fe *in_stack_fffffffffffff4b0;
  secp256k1_gej *in_stack_fffffffffffff4b8;
  secp256k1_ge *in_stack_fffffffffffff4c0;
  secp256k1_ge *in_stack_fffffffffffff4e8;
  secp256k1_gej *in_stack_fffffffffffff4f0;
  uchar *in_stack_fffffffffffff508;
  secp256k1_pubkey *in_stack_fffffffffffff510;
  secp256k1_context *in_stack_fffffffffffff518;
  uchar *in_stack_fffffffffffff570;
  uchar *in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff580;
  int in_stack_fffffffffffff584;
  secp256k1_context *in_stack_fffffffffffff588;
  secp256k1_context *psVar4;
  uchar *in_stack_fffffffffffff590;
  code *ell_b64_00;
  secp256k1_sha256 *ell_b64_01;
  uchar *in_stack_fffffffffffff598;
  uchar *in_stack_fffffffffffff5a0;
  secp256k1_context *in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5b0;
  int in_stack_fffffffffffff5b4;
  secp256k1_context *in_stack_fffffffffffff5b8;
  secp256k1_fe *in_stack_fffffffffffff5c0;
  secp256k1_fe *in_stack_fffffffffffff5c8;
  undefined1 local_a28 [32];
  undefined1 local_a08 [32];
  undefined1 local_9e8 [32];
  undefined1 local_9c8 [64];
  undefined1 local_988 [64];
  undefined1 local_948 [64];
  undefined1 local_908 [128];
  undefined8 local_888;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  int local_784;
  secp256k1_fe local_640 [9];
  int local_4bc;
  secp256k1_sha256 local_4b8 [3];
  secp256k1_scalar *in_stack_fffffffffffffc98;
  secp256k1_scalar *in_stack_fffffffffffffca0;
  secp256k1_gej *in_stack_fffffffffffffca8;
  secp256k1_gej *in_stack_fffffffffffffcb0;
  uchar local_318 [440];
  long local_160;
  long local_158;
  uint local_150;
  int local_14c;
  undefined1 local_148 [40];
  ellswift_xdh_test *local_120;
  int local_114;
  secp256k1_fe asStack_e8 [2];
  ellswift_decode_test *local_78;
  uint local_44;
  int local_14;
  ellswift_xswiftec_inv_test *local_10;
  uint local_4;
  
  for (local_4 = 0; local_4 < 0x20; local_4 = local_4 + 1) {
    local_10 = ellswift_xswiftec_inv_tests + (int)local_4;
    for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
      local_44 = secp256k1_ellswift_xswiftec_inv_var
                           (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                            (secp256k1_fe *)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b4);
      if (local_44 != (local_10->enc_bitmap >> ((byte)local_14 & 0x1f) & 1U)) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0xbc,"test condition failed: ret == ((testcase->enc_bitmap >> c) & 1)");
        abort();
      }
      if (local_44 != 0) {
        iVar1 = fe_equal(&in_stack_fffffffffffff4c0->x,&in_stack_fffffffffffff4b8->x);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                  ,0xbf,"test condition failed: fe_equal(&t, &testcase->encs[c])");
          abort();
        }
        secp256k1_ellswift_xswiftec_var
                  (&in_stack_fffffffffffff4c0->x,&in_stack_fffffffffffff4b8->x,
                   in_stack_fffffffffffff4b0);
        iVar1 = fe_equal(&in_stack_fffffffffffff4c0->x,&in_stack_fffffffffffff4b8->x);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                  ,0xc1,"test condition failed: fe_equal(&testcase->x, &x2)");
          abort();
        }
      }
    }
  }
  for (local_4 = 0; local_4 < 0x4c; local_4 = local_4 + 1) {
    local_78 = ellswift_decode_tests + (int)local_4;
    local_114 = secp256k1_ellswift_decode
                          (in_stack_fffffffffffff518,in_stack_fffffffffffff510,
                           in_stack_fffffffffffff508);
    if (local_114 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xcb,"test condition failed: ret");
      abort();
    }
    local_114 = secp256k1_pubkey_load
                          ((secp256k1_context *)
                           CONCAT17(in_stack_fffffffffffff47f,
                                    CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)),
                           (secp256k1_ge *)in_stack_fffffffffffff470,
                           (secp256k1_pubkey *)in_stack_fffffffffffff468);
    if (local_114 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xcd,"test condition failed: ret");
      abort();
    }
    iVar1 = fe_equal(&in_stack_fffffffffffff4c0->x,&in_stack_fffffffffffff4b8->x);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xce,"test condition failed: fe_equal(&testcase->x, &ge.x)");
      abort();
    }
    iVar1 = secp256k1_fe_impl_is_odd(asStack_e8);
    if (iVar1 != local_78->odd_y) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xcf,"test condition failed: secp256k1_fe_is_odd(&ge.y) == testcase->odd_y");
      abort();
    }
  }
  for (local_4 = 0; local_4 < 7; local_4 = local_4 + 1) {
    lVar3 = (long)(int)local_4;
    local_b60 = lVar3 * 0xc4;
    local_120 = ellswift_xdh_tests_bip324 + lVar3;
    local_150 = (uint)((ellswift_xdh_tests_bip324[lVar3].initiating != 0 ^ 0xffU) & 1);
    if (local_150 == 0) {
      local_b58 = local_b60 + 0x15fa50;
    }
    else {
      local_b58 = local_b60 + 0x15fa90;
    }
    local_158 = local_b58;
    if (local_150 == 0) {
      local_b60 = local_b60 + 0x15fa90;
    }
    else {
      local_b60 = local_b60 + 0x15fa50;
    }
    local_160 = local_b60;
    in_stack_fffffffffffff468 = ellswift_xdh_hash_function_bip324;
    in_stack_fffffffffffff470 = (secp256k1_context *)0x0;
    local_14c = secp256k1_ellswift_xdh
                          (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                           in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                           (uchar *)in_stack_fffffffffffff588,in_stack_fffffffffffff584,
                           (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                           in_stack_fffffffffffff5c8);
    if (local_14c == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xde,"test condition failed: ret");
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_148,local_120->shared_secret,0x20);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xdf,
              "test condition failed: secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0"
             );
      abort();
    }
  }
  for (local_4 = 0; SBORROW4(local_4,COUNT * 1000) != (int)(local_4 + COUNT * -1000) < 0;
      local_4 = local_4 + 1) {
    testutil_random_ge_test((secp256k1_ge *)in_stack_fffffffffffff490);
    secp256k1_pubkey_save
              ((secp256k1_pubkey *)in_stack_fffffffffffff470,
               (secp256k1_ge *)in_stack_fffffffffffff468);
    testrand256((uchar *)in_stack_fffffffffffff470);
    secp256k1_ellswift_encode
              (in_stack_fffffffffffff5b8,
               (uchar *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (secp256k1_pubkey *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    secp256k1_ellswift_decode
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    secp256k1_pubkey_load
              ((secp256k1_context *)
               CONCAT17(in_stack_fffffffffffff47f,
                        CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)),
               (secp256k1_ge *)in_stack_fffffffffffff470,
               (secp256k1_pubkey *)in_stack_fffffffffffff468);
    iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffff498,(secp256k1_ge *)in_stack_fffffffffffff490)
    ;
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0xf0,"test condition failed: secp256k1_ge_eq_var(&g, &g2)");
      abort();
    }
  }
  for (local_4 = 0; SBORROW4(local_4,COUNT * 400) != (int)(local_4 + COUNT * -400) < 0;
      local_4 = local_4 + 1) {
    if ((local_4 & 1) != 0) {
      testrand256_test((uchar *)0x10b273);
    }
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffff490);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffff470,(secp256k1_scalar *)in_stack_fffffffffffff468);
    in_stack_fffffffffffff490 = local_4b8;
    if ((local_4 & 1) == 0) {
      in_stack_fffffffffffff480 = (uchar *)0x0;
    }
    else {
      in_stack_fffffffffffff480 = local_318;
    }
    in_stack_fffffffffffff488 = CTX;
    local_4bc = secp256k1_ellswift_create
                          (in_stack_fffffffffffff588,
                           (uchar *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
                           in_stack_fffffffffffff578,in_stack_fffffffffffff570);
    if (local_4bc == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x101,"test condition failed: ret");
      abort();
    }
    secp256k1_ellswift_decode
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    secp256k1_pubkey_load
              ((secp256k1_context *)
               CONCAT17(in_stack_fffffffffffff47f,
                        CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)),
               (secp256k1_ge *)in_stack_fffffffffffff470,
               (secp256k1_pubkey *)in_stack_fffffffffffff468);
    secp256k1_ecmult(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                     in_stack_fffffffffffffc98);
    iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x106,"test condition failed: secp256k1_gej_eq_ge_var(&res, &dec)");
      abort();
    }
  }
  for (local_4 = 0; SBORROW4(local_4,COUNT * 800) != (int)(local_4 + COUNT * -800) < 0;
      local_4 = local_4 + 1) {
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffff490);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffff470,(secp256k1_scalar *)in_stack_fffffffffffff468);
    testrand256_test((uchar *)0x10b471);
    testrand256_test((uchar *)0x10b482);
    secp256k1_ellswift_decode
              (in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    secp256k1_pubkey_load
              ((secp256k1_context *)
               CONCAT17(in_stack_fffffffffffff47f,
                        CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)),
               (secp256k1_ge *)in_stack_fffffffffffff470,
               (secp256k1_pubkey *)in_stack_fffffffffffff468);
    secp256k1_gej_set_ge
              ((secp256k1_gej *)in_stack_fffffffffffff470,(secp256k1_ge *)in_stack_fffffffffffff468)
    ;
    in_stack_fffffffffffff468 = ellswift_xdh_hash_x32;
    in_stack_fffffffffffff470 = (secp256k1_context *)0x0;
    local_784 = secp256k1_ellswift_xdh
                          (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                           in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                           (uchar *)in_stack_fffffffffffff588,in_stack_fffffffffffff584,
                           (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                           in_stack_fffffffffffff5c8);
    if (local_784 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x11e,"test condition failed: ret");
      abort();
    }
    secp256k1_fe_impl_set_b32_limit
              ((secp256k1_fe *)in_stack_fffffffffffff470,(uchar *)in_stack_fffffffffffff468);
    secp256k1_fe_verify(local_640);
    secp256k1_ecmult(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
                     in_stack_fffffffffffffc98);
    secp256k1_ge_set_gej(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
    iVar1 = fe_equal(&in_stack_fffffffffffff4c0->x,&in_stack_fffffffffffff4b8->x);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x125,"test condition failed: fe_equal(&res.x, &share_x)");
      abort();
    }
  }
  local_4 = 0;
  do {
    if (SBORROW4(local_4,COUNT * 200) == (int)(local_4 + COUNT * -200) < 0) {
      secp256k1_sha256_initialize_tagged
                (in_stack_fffffffffffff490,(uchar *)in_stack_fffffffffffff488,
                 (size_t)in_stack_fffffffffffff480);
      secp256k1_ellswift_sha256_init_encode((secp256k1_sha256 *)0x10c488);
      test_sha256_eq((secp256k1_sha256 *)in_stack_fffffffffffff470,
                     (secp256k1_sha256 *)in_stack_fffffffffffff468);
      secp256k1_sha256_initialize_tagged
                (in_stack_fffffffffffff490,(uchar *)in_stack_fffffffffffff488,
                 (size_t)in_stack_fffffffffffff480);
      secp256k1_ellswift_sha256_init_create((secp256k1_sha256 *)0x10c4bd);
      test_sha256_eq((secp256k1_sha256 *)in_stack_fffffffffffff470,
                     (secp256k1_sha256 *)in_stack_fffffffffffff468);
      secp256k1_sha256_initialize_tagged
                (in_stack_fffffffffffff490,(uchar *)in_stack_fffffffffffff488,
                 (size_t)in_stack_fffffffffffff480);
      secp256k1_ellswift_sha256_init_bip324((secp256k1_sha256 *)0x10c4f2);
      test_sha256_eq((secp256k1_sha256 *)in_stack_fffffffffffff470,
                     (secp256k1_sha256 *)in_stack_fffffffffffff468);
      return;
    }
    if ((int)local_4 % 3 == 0) {
      ell_b64_00 = ellswift_xdh_hash_x32;
      psVar4 = (secp256k1_context *)0x0;
    }
    else if ((int)local_4 % 3 == 1) {
      ell_b64_00 = ellswift_xdh_hash_function_bip324;
      psVar4 = (secp256k1_context *)0x0;
    }
    else {
      ell_b64_00 = ellswift_xdh_hash_function_prefix;
      testrand256_test((uchar *)0x10b6e3);
      testrand256_test((uchar *)0x10b6f4);
      psVar4 = (secp256k1_context *)&stack0xfffffffffffff598;
    }
    testrand256_test((uchar *)0x10b713);
    testrand256_test((uchar *)0x10b720);
    testutil_random_scalar_order_test((secp256k1_scalar *)in_stack_fffffffffffff490);
    testutil_random_scalar_order((secp256k1_scalar *)in_stack_fffffffffffff490);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffff470,(secp256k1_scalar *)in_stack_fffffffffffff468);
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffff470,(secp256k1_scalar *)in_stack_fffffffffffff468);
    iVar1 = secp256k1_ellswift_create
                      (psVar4,(uchar *)CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580)
                       ,in_stack_fffffffffffff578,in_stack_fffffffffffff570);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x14e,"test condition failed: ret");
      abort();
    }
    iVar1 = secp256k1_ellswift_create
                      (psVar4,(uchar *)CONCAT44(iVar1,in_stack_fffffffffffff580),
                       in_stack_fffffffffffff578,in_stack_fffffffffffff570);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x151,"test condition failed: ret");
      abort();
    }
    iVar1 = secp256k1_ellswift_xdh
                      (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598
                       ,(uchar *)ell_b64_00,(uchar *)psVar4,iVar1,
                       (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                       in_stack_fffffffffffff5c8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x156,"test condition failed: ret");
      abort();
    }
    iVar1 = secp256k1_ellswift_xdh
                      (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598
                       ,(uchar *)ell_b64_00,(uchar *)psVar4,iVar1,
                       (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                       in_stack_fffffffffffff5c8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x159,"test condition failed: ret");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_9e8,local_a08,0x20);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x15b,"test condition failed: secp256k1_memcmp_var(share32a, share32b, 32) == 0");
      abort();
    }
    memcpy(local_9c8,local_948,0x40);
    testrand_flip(in_stack_fffffffffffff480,
                  CONCAT17(in_stack_fffffffffffff47f,
                           CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
    iVar1 = secp256k1_ellswift_xdh
                      (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598
                       ,(uchar *)ell_b64_00,(uchar *)psVar4,iVar1,
                       (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                       in_stack_fffffffffffff5c8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x162,"test condition failed: ret");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_a28,local_9e8,0x20);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x163,"test condition failed: secp256k1_memcmp_var(share32_bad, share32a, 32) != 0");
      abort();
    }
    memcpy(local_988,local_908,0x40);
    testrand_flip(in_stack_fffffffffffff480,
                  CONCAT17(in_stack_fffffffffffff47f,
                           CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
    iVar1 = secp256k1_ellswift_xdh
                      (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598
                       ,(uchar *)ell_b64_00,(uchar *)psVar4,iVar1,
                       (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                       in_stack_fffffffffffff5c8);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x168,"test condition failed: ret");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_a28,local_a08,0x20);
    if (iVar2 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x169,"test condition failed: secp256k1_memcmp_var(share32_bad, share32b, 32) != 0");
      abort();
    }
    local_868 = local_828;
    local_860 = local_820;
    local_858 = local_818;
    local_850 = local_810;
    testrand_flip(in_stack_fffffffffffff480,
                  CONCAT17(in_stack_fffffffffffff47f,
                           CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
    iVar1 = secp256k1_ellswift_xdh
                      (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598
                       ,(uchar *)ell_b64_00,(uchar *)psVar4,iVar1,
                       (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                       in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff47f = true;
    in_stack_fffffffffffff470 = psVar4;
    in_stack_fffffffffffff468 = ell_b64_00;
    if (iVar1 != 0) {
      iVar2 = secp256k1_memcmp_var(local_a28,local_9e8,0x20);
      in_stack_fffffffffffff47f = iVar2 != 0;
      in_stack_fffffffffffff470 = psVar4;
      in_stack_fffffffffffff468 = ell_b64_00;
    }
    if (((in_stack_fffffffffffff47f ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x170,
              "test condition failed: !ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0")
      ;
      abort();
    }
    local_888 = local_848;
    local_880 = local_840;
    local_878 = local_838;
    local_870 = local_830;
    testrand_flip(in_stack_fffffffffffff480,
                  CONCAT17(in_stack_fffffffffffff47f,
                           CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
    psVar4 = in_stack_fffffffffffff470;
    ell_b64_01 = (secp256k1_sha256 *)in_stack_fffffffffffff468;
    in_stack_fffffffffffff584 =
         secp256k1_ellswift_xdh
                   (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                    (uchar *)in_stack_fffffffffffff468,(uchar *)in_stack_fffffffffffff470,iVar1,
                    (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                    in_stack_fffffffffffff5c8);
    in_stack_fffffffffffff47e = true;
    if (in_stack_fffffffffffff584 != 0) {
      iVar1 = secp256k1_memcmp_var(local_a28,local_a08,0x20);
      in_stack_fffffffffffff47e = iVar1 != 0;
    }
    if (((in_stack_fffffffffffff47e ^ 0xff) & 1) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
              ,0x175,
              "test condition failed: !ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0")
      ;
      abort();
    }
    if (ell_b64_01 != (secp256k1_sha256 *)ellswift_xdh_hash_x32) {
      local_808 = local_7c8;
      local_800 = local_7c0;
      local_7f8 = local_7b8;
      local_7f0 = local_7b0;
      testrand_flip(in_stack_fffffffffffff480,
                    CONCAT17(in_stack_fffffffffffff47f,
                             CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
      iVar1 = secp256k1_ellswift_create
                        (psVar4,(uchar *)CONCAT44(in_stack_fffffffffffff584,
                                                  in_stack_fffffffffffff580),
                         in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x17d,"test condition failed: ret");
        abort();
      }
      iVar1 = secp256k1_ellswift_xdh
                        (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                         in_stack_fffffffffffff598,(uchar *)ell_b64_01,(uchar *)psVar4,iVar1,
                         (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                         in_stack_fffffffffffff5c8);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x17f,"test condition failed: ret");
        abort();
      }
      iVar2 = secp256k1_memcmp_var(local_a28,local_9e8,0x20);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x180,"test condition failed: secp256k1_memcmp_var(share32_bad, share32a, 32) != 0"
               );
        abort();
      }
      local_7e8 = local_7a8;
      local_7e0 = local_7a0;
      local_7d8 = local_798;
      local_7d0 = local_790;
      testrand_flip(in_stack_fffffffffffff480,
                    CONCAT17(in_stack_fffffffffffff47f,
                             CONCAT16(in_stack_fffffffffffff47e,in_stack_fffffffffffff478)));
      iVar1 = secp256k1_ellswift_create
                        (psVar4,(uchar *)CONCAT44(iVar1,in_stack_fffffffffffff580),
                         in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x185,"test condition failed: ret");
        abort();
      }
      iVar1 = secp256k1_ellswift_xdh
                        (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                         in_stack_fffffffffffff598,(uchar *)ell_b64_01,(uchar *)psVar4,iVar1,
                         (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                         in_stack_fffffffffffff5c8);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x187,"test condition failed: ret");
        abort();
      }
      iVar2 = secp256k1_memcmp_var(local_a28,local_a08,0x20);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x188,"test condition failed: secp256k1_memcmp_var(share32_bad, share32b, 32) != 0"
               );
        abort();
      }
      iVar1 = secp256k1_ellswift_xdh
                        (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                         in_stack_fffffffffffff598,(uchar *)ell_b64_01,(uchar *)psVar4,iVar1,
                         (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                         in_stack_fffffffffffff5c8);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x18d,"test condition failed: ret");
        abort();
      }
      in_stack_fffffffffffff470 = psVar4;
      in_stack_fffffffffffff468 = (code *)ell_b64_01;
      iVar2 = secp256k1_memcmp_var(local_a28,local_9e8,0x20);
      if (iVar2 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x18e,"test condition failed: secp256k1_memcmp_var(share32_bad, share32a, 32) != 0"
               );
        abort();
      }
      in_stack_fffffffffffff584 =
           secp256k1_ellswift_xdh
                     (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                      (uchar *)in_stack_fffffffffffff468,(uchar *)in_stack_fffffffffffff470,iVar1,
                      (secp256k1_ellswift_xdh_hash_function)in_stack_fffffffffffff5c0,
                      in_stack_fffffffffffff5c8);
      if (in_stack_fffffffffffff584 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x191,"test condition failed: ret");
        abort();
      }
      iVar1 = secp256k1_memcmp_var(local_a28,local_a08,0x20);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/ellswift/tests_impl.h"
                ,0x192,"test condition failed: secp256k1_memcmp_var(share32_bad, share32b, 32) != 0"
               );
        abort();
      }
    }
    local_4 = local_4 + 1;
  } while( true );
}

Assistant:

void run_ellswift_tests(void) {
    int i = 0;
    /* Test vectors. */
    for (i = 0; (unsigned)i < sizeof(ellswift_xswiftec_inv_tests) / sizeof(ellswift_xswiftec_inv_tests[0]); ++i) {
        const struct ellswift_xswiftec_inv_test *testcase = &ellswift_xswiftec_inv_tests[i];
        int c;
        for (c = 0; c < 8; ++c) {
            secp256k1_fe t;
            int ret = secp256k1_ellswift_xswiftec_inv_var(&t, &testcase->x, &testcase->u, c);
            CHECK(ret == ((testcase->enc_bitmap >> c) & 1));
            if (ret) {
                secp256k1_fe x2;
                CHECK(fe_equal(&t, &testcase->encs[c]));
                secp256k1_ellswift_xswiftec_var(&x2, &testcase->u, &testcase->encs[c]);
                CHECK(fe_equal(&testcase->x, &x2));
            }
        }
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_decode_tests) / sizeof(ellswift_decode_tests[0]); ++i) {
        const struct ellswift_decode_test *testcase = &ellswift_decode_tests[i];
        secp256k1_pubkey pubkey;
        secp256k1_ge ge;
        int ret;
        ret = secp256k1_ellswift_decode(CTX, &pubkey, testcase->enc);
        CHECK(ret);
        ret = secp256k1_pubkey_load(CTX, &ge, &pubkey);
        CHECK(ret);
        CHECK(fe_equal(&testcase->x, &ge.x));
        CHECK(secp256k1_fe_is_odd(&ge.y) == testcase->odd_y);
    }
    for (i = 0; (unsigned)i < sizeof(ellswift_xdh_tests_bip324) / sizeof(ellswift_xdh_tests_bip324[0]); ++i) {
        const struct ellswift_xdh_test *test = &ellswift_xdh_tests_bip324[i];
        unsigned char shared_secret[32];
        int ret;
        int party = !test->initiating;
        const unsigned char* ell_a64 = party ? test->ellswift_theirs : test->ellswift_ours;
        const unsigned char* ell_b64 = party ? test->ellswift_ours   : test->ellswift_theirs;
        ret = secp256k1_ellswift_xdh(CTX, shared_secret,
                                     ell_a64, ell_b64,
                                     test->priv_ours,
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(shared_secret, test->shared_secret, 32) == 0);
    }
    /* Verify that secp256k1_ellswift_encode + decode roundtrips. */
    for (i = 0; i < 1000 * COUNT; i++) {
        unsigned char rnd32[32];
        unsigned char ell64[64];
        secp256k1_ge g, g2;
        secp256k1_pubkey pubkey, pubkey2;
        /* Generate random public key and random randomizer. */
        testutil_random_ge_test(&g);
        secp256k1_pubkey_save(&pubkey, &g);
        testrand256(rnd32);
        /* Convert the public key to ElligatorSwift and back. */
        secp256k1_ellswift_encode(CTX, ell64, &pubkey, rnd32);
        secp256k1_ellswift_decode(CTX, &pubkey2, ell64);
        secp256k1_pubkey_load(CTX, &g2, &pubkey2);
        /* Compare with original. */
        CHECK(secp256k1_ge_eq_var(&g, &g2));
    }
    /* Verify the behavior of secp256k1_ellswift_create */
    for (i = 0; i < 400 * COUNT; i++) {
        unsigned char auxrnd32[32], sec32[32];
        secp256k1_scalar sec;
        secp256k1_gej res;
        secp256k1_ge dec;
        secp256k1_pubkey pub;
        unsigned char ell64[64];
        int ret;
        /* Generate random secret key and random randomizer. */
        if (i & 1) testrand256_test(auxrnd32);
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Construct ElligatorSwift-encoded public keys for that key. */
        ret = secp256k1_ellswift_create(CTX, ell64, sec32, (i & 1) ? auxrnd32 : NULL);
        CHECK(ret);
        /* Decode it, and compare with traditionally-computed public key. */
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_ecmult(&res, NULL, &secp256k1_scalar_zero, &sec);
        CHECK(secp256k1_gej_eq_ge_var(&res, &dec));
    }
    /* Verify that secp256k1_ellswift_xdh computes the right shared X coordinate. */
    for (i = 0; i < 800 * COUNT; i++) {
        unsigned char ell64[64], sec32[32], share32[32];
        secp256k1_scalar sec;
        secp256k1_ge dec, res;
        secp256k1_fe share_x;
        secp256k1_gej decj, resj;
        secp256k1_pubkey pub;
        int ret;
        /* Generate random secret key. */
        testutil_random_scalar_order_test(&sec);
        secp256k1_scalar_get_b32(sec32, &sec);
        /* Generate random ElligatorSwift encoding for the remote key and decode it. */
        testrand256_test(ell64);
        testrand256_test(ell64 + 32);
        secp256k1_ellswift_decode(CTX, &pub, ell64);
        secp256k1_pubkey_load(CTX, &dec, &pub);
        secp256k1_gej_set_ge(&decj, &dec);
        /* Compute the X coordinate of seckey*pubkey using ellswift_xdh. Note that we
         * pass ell64 as claimed (but incorrect) encoding for sec32 here; this works
         * because the "hasher" function we use here ignores the ell64 arguments. */
        ret = secp256k1_ellswift_xdh(CTX, share32, ell64, ell64, sec32, i & 1, &ellswift_xdh_hash_x32, NULL);
        CHECK(ret);
        (void)secp256k1_fe_set_b32_limit(&share_x, share32); /* no overflow is possible */
        SECP256K1_FE_VERIFY(&share_x);
        /* Compute seckey*pubkey directly. */
        secp256k1_ecmult(&resj, &decj, &sec, NULL);
        secp256k1_ge_set_gej(&res, &resj);
        /* Compare. */
        CHECK(fe_equal(&res.x, &share_x));
    }
    /* Verify the joint behavior of secp256k1_ellswift_xdh */
    for (i = 0; i < 200 * COUNT; i++) {
        unsigned char auxrnd32a[32], auxrnd32b[32], auxrnd32a_bad[32], auxrnd32b_bad[32];
        unsigned char sec32a[32], sec32b[32], sec32a_bad[32], sec32b_bad[32];
        secp256k1_scalar seca, secb;
        unsigned char ell64a[64], ell64b[64], ell64a_bad[64], ell64b_bad[64];
        unsigned char share32a[32], share32b[32], share32_bad[32];
        unsigned char prefix64[64];
        secp256k1_ellswift_xdh_hash_function hash_function;
        void* data;
        int ret;

        /* Pick hasher to use. */
        if ((i % 3) == 0) {
            hash_function = ellswift_xdh_hash_x32;
            data = NULL;
        } else if ((i % 3) == 1) {
            hash_function = secp256k1_ellswift_xdh_hash_function_bip324;
            data = NULL;
        } else {
            hash_function = secp256k1_ellswift_xdh_hash_function_prefix;
            testrand256_test(prefix64);
            testrand256_test(prefix64 + 32);
            data = prefix64;
        }

        /* Generate random secret keys and random randomizers. */
        testrand256_test(auxrnd32a);
        testrand256_test(auxrnd32b);
        testutil_random_scalar_order_test(&seca);
        /* Draw secb uniformly at random to make sure that the secret keys
         * differ */
        testutil_random_scalar_order(&secb);
        secp256k1_scalar_get_b32(sec32a, &seca);
        secp256k1_scalar_get_b32(sec32b, &secb);

        /* Construct ElligatorSwift-encoded public keys for those keys. */
        /* For A: */
        ret = secp256k1_ellswift_create(CTX, ell64a, sec32a, auxrnd32a);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_create(CTX, ell64b, sec32b, auxrnd32b);
        CHECK(ret);

        /* Compute the shared secret both ways and compare with each other. */
        /* For A: */
        ret = secp256k1_ellswift_xdh(CTX, share32a, ell64a, ell64b, sec32a, 0, hash_function, data);
        CHECK(ret);
        /* For B: */
        ret = secp256k1_ellswift_xdh(CTX, share32b, ell64a, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        /* And compare: */
        CHECK(secp256k1_memcmp_var(share32a, share32b, 32) == 0);

        /* Verify that the shared secret doesn't match if other side's public key is incorrect. */
        /* For A (using a bad public key for B): */
        memcpy(ell64b_bad, ell64b, sizeof(ell64a_bad));
        testrand_flip(ell64b_bad, sizeof(ell64b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
        CHECK(ret); /* Mismatching encodings don't get detected by secp256k1_ellswift_xdh. */
        CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B (using a bad public key for A): */
        memcpy(ell64a_bad, ell64a, sizeof(ell64a_bad));
        testrand_flip(ell64a_bad, sizeof(ell64a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
        CHECK(ret);
        CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        /* Verify that the shared secret doesn't match if the private key is incorrect. */
        /* For A: */
        memcpy(sec32a_bad, sec32a, sizeof(sec32a_bad));
        testrand_flip(sec32a_bad, sizeof(sec32a_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a_bad, 0, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
        /* For B: */
        memcpy(sec32b_bad, sec32b, sizeof(sec32b_bad));
        testrand_flip(sec32b_bad, sizeof(sec32b_bad));
        ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b_bad, 1, hash_function, data);
        CHECK(!ret || secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

        if (hash_function != ellswift_xdh_hash_x32) {
            /* Verify that the shared secret doesn't match when a different encoding of the same public key is used. */
            /* For A (changing B's public key): */
            memcpy(auxrnd32b_bad, auxrnd32b, sizeof(auxrnd32b_bad));
            testrand_flip(auxrnd32b_bad, sizeof(auxrnd32b_bad));
            ret = secp256k1_ellswift_create(CTX, ell64b_bad, sec32b, auxrnd32b_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b_bad, sec32a, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (changing A's public key): */
            memcpy(auxrnd32a_bad, auxrnd32a, sizeof(auxrnd32a_bad));
            testrand_flip(auxrnd32a_bad, sizeof(auxrnd32a_bad));
            ret = secp256k1_ellswift_create(CTX, ell64a_bad, sec32a, auxrnd32a_bad);
            CHECK(ret);
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a_bad, ell64b, sec32b, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);

            /* Verify that swapping sides changes the shared secret. */
            /* For A (claiming to be B): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32a, 1, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32a, 32) != 0);
            /* For B (claiming to be A): */
            ret = secp256k1_ellswift_xdh(CTX, share32_bad, ell64a, ell64b, sec32b, 0, hash_function, data);
            CHECK(ret);
            CHECK(secp256k1_memcmp_var(share32_bad, share32b, 32) != 0);
        }
    }

    /* Test hash initializers. */
    {
        secp256k1_sha256 sha, sha_optimized;
        static const unsigned char encode_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'e', 'n', 'c', 'o', 'd', 'e'};
        static const unsigned char create_tag[] = {'s', 'e', 'c', 'p', '2', '5', '6', 'k', '1', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'c', 'r', 'e', 'a', 't', 'e'};
        static const unsigned char bip324_tag[] = {'b', 'i', 'p', '3', '2', '4', '_', 'e', 'l', 'l', 's', 'w', 'i', 'f', 't', '_', 'x', 'o', 'n', 'l', 'y', '_', 'e', 'c', 'd', 'h'};

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_encode has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, encode_tag, sizeof(encode_tag));
        secp256k1_ellswift_sha256_init_encode(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_create has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, create_tag, sizeof(create_tag));
        secp256k1_ellswift_sha256_init_create(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);

        /* Check that hash initialized by
         * secp256k1_ellswift_sha256_init_bip324 has the expected
         * state. */
        secp256k1_sha256_initialize_tagged(&sha, bip324_tag, sizeof(bip324_tag));
        secp256k1_ellswift_sha256_init_bip324(&sha_optimized);
        test_sha256_eq(&sha, &sha_optimized);
    }
}